

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderAtomicMaxCase::getInputs
          (ShaderAtomicMaxCase *this,int numValues,int stride,void *inputs)

{
  Precision PVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  Random rnd;
  deRandom local_40;
  
  dVar2 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar2);
  PVar1 = (this->super_ShaderAtomicOpCase).m_precision;
  iVar3 = -1000;
  if (PVar1 == PRECISION_LOWP) {
    iVar3 = -100;
  }
  iVar4 = 0;
  if ((this->super_ShaderAtomicOpCase).m_type != TYPE_INT) {
    iVar3 = 0;
  }
  if (0 < numValues) {
    iVar6 = 1000;
    if (PVar1 == PRECISION_LOWP) {
      iVar6 = 100;
    }
    uVar5 = (ulong)(uint)numValues;
    do {
      dVar2 = deRandom_getUint32(&local_40);
      *(uint *)((long)inputs + (long)iVar4) = dVar2 % (iVar6 - iVar3 | 1U) + iVar3;
      iVar4 = iVar4 + stride;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random	rnd			(deStringHash(getName()));
		const bool	isSigned	= m_type == TYPE_INT;
		const int	maxVal		= m_precision == PRECISION_LOWP ? 100 : 1000;
		const int	minVal		= isSigned ? -maxVal : 0;

		for (int valNdx = 0; valNdx < numValues; valNdx++)
			*(int*)((deUint8*)inputs + stride*valNdx) = rnd.getInt(minVal, maxVal);
	}